

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e0a3::BuildEngineTest_incrementalDependency_Test::TestBody
          (BuildEngineTest_incrementalDependency_Test *this)

{
  initializer_list<llbuild::core::KeyType> __l;
  bool bVar1;
  CustomDB *this_00;
  SimpleRule *pSVar2;
  ValueType *pVVar3;
  char *pcVar4;
  unordered_map<llbuild::core::KeyType,_llbuild::core::Result,_std::hash<llbuild::core::KeyType>,_std::equal_to<llbuild::core::KeyType>,_std::allocator<std::pair<const_llbuild::core::KeyType,_llbuild::core::Result>_>_>
  *this_01;
  mapped_type *value;
  KeyType *local_360;
  AssertHelper local_358;
  Message local_350;
  size_t local_348;
  uint local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_3;
  Message local_320;
  int32_t local_318;
  int local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_2;
  Result *valueRResult;
  Message local_2d0;
  KeyType local_2c8;
  int32_t local_2a8;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_1;
  Message local_288;
  KeyType local_280;
  int32_t local_260;
  int local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  function<void_(llbuild::core::Rule::StatusKind)> local_240;
  function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)> local_220;
  anon_class_8_1_70098e2e local_200;
  ComputeFnType local_1f8;
  allocator<llbuild::core::KeyType> local_1d1;
  KeyType local_1d0;
  iterator local_1b0;
  size_type local_1a8;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_1a0;
  KeyType local_188;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_168;
  CommandSignature local_160;
  function<void_(llbuild::core::Rule::StatusKind)> local_158;
  anon_class_8_1_70098e2e local_138;
  ValidFnType local_130;
  anon_class_8_1_70098e2e local_110;
  ComputeFnType local_108;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_e8;
  KeyType local_d0;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_b0;
  int local_a4;
  int valueA;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> local_98;
  undefined1 local_90 [8];
  string error;
  CustomDB *db;
  BuildEngine engine;
  SimpleBuildEngineDelegate delegate;
  BuildEngineTest_incrementalDependency_Test *this_local;
  
  SimpleBuildEngineDelegate::SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  llbuild::core::BuildEngine::BuildEngine((BuildEngine *)&db,(BuildEngineDelegate *)&engine);
  this_00 = (CustomDB *)operator_new(0x60);
  memset(this_00,0,0x60);
  TestBody::CustomDB::CustomDB(this_00);
  error.field_2._8_8_ = this_00;
  std::__cxx11::string::string((string *)local_90);
  std::
  unique_ptr<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB,std::default_delete<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB>>
  ::
  unique_ptr<std::default_delete<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB>,void>
            ((unique_ptr<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB,std::default_delete<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB>>
              *)&stack0xffffffffffffff60,(pointer)error.field_2._8_8_);
  std::unique_ptr<llbuild::core::BuildDB,std::default_delete<llbuild::core::BuildDB>>::
  unique_ptr<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB,std::default_delete<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::CustomDB>,void>
            ((unique_ptr<llbuild::core::BuildDB,std::default_delete<llbuild::core::BuildDB>> *)
             &local_98,
             (unique_ptr<CustomDB,_std::default_delete<CustomDB>_> *)&stack0xffffffffffffff60);
  llbuild::core::BuildEngine::attachDB((BuildEngine *)&db,&local_98,(string *)local_90);
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::~unique_ptr
            (&local_98);
  std::unique_ptr<CustomDB,_std::default_delete<CustomDB>_>::~unique_ptr
            ((unique_ptr<CustomDB,_std::default_delete<CustomDB>_> *)&stack0xffffffffffffff60);
  local_a4 = 2;
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_d0,"value-A");
  memset(&local_e8,0,0x18);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector(&local_e8);
  local_110.valueA = &local_a4;
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::__0,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_108,&local_110);
  local_138.valueA = &local_a4;
  std::function<bool(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::__1,void>
            ((function<bool(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)> *)
             &local_130,&local_138);
  std::function<void_(llbuild::core::Rule::StatusKind)>::function(&local_158,(nullptr_t)0x0);
  memset(&local_160,0,8);
  llbuild::basic::CommandSignature::CommandSignature(&local_160);
  SimpleRule::SimpleRule(pSVar2,&local_d0,&local_e8,&local_108,&local_130,&local_158,&local_160);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_b0,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule((BuildEngine *)&db,&local_b0);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_b0);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_158);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_130);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_108);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_e8);
  llbuild::core::KeyType::~KeyType(&local_d0);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  llbuild::core::KeyType::KeyType(&local_188,"value-R");
  llbuild::core::KeyType::KeyType(&local_1d0,"value-A");
  local_1b0 = &local_1d0;
  local_1a8 = 1;
  std::allocator<llbuild::core::KeyType>::allocator(&local_1d1);
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&local_1a0,__l,&local_1d1);
  local_200.valueA = &local_a4;
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineTest_incrementalDependency_Test::TestBody()::__2,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_1f8,&local_200);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&local_220,(nullptr_t)0x0);
  std::function<void_(llbuild::core::Rule::StatusKind)>::function(&local_240,(nullptr_t)0x0);
  memset(&gtest_ar.message_,0,8);
  llbuild::basic::CommandSignature::CommandSignature((CommandSignature *)&gtest_ar.message_);
  SimpleRule::SimpleRule
            (pSVar2,&local_188,&local_1a0,&local_1f8,&local_220,&local_240,
             (CommandSignature *)&gtest_ar.message_);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_168,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule((BuildEngine *)&db,&local_168);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_168);
  std::function<void_(llbuild::core::Rule::StatusKind)>::~function(&local_240);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::
  ~function(&local_220);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_1f8);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_1a0);
  std::allocator<llbuild::core::KeyType>::~allocator(&local_1d1);
  local_360 = (KeyType *)&local_1b0;
  do {
    local_360 = local_360 + -1;
    llbuild::core::KeyType::~KeyType(local_360);
  } while (local_360 != &local_1d0);
  llbuild::core::KeyType::~KeyType(&local_188);
  local_25c = local_a4 * 3;
  llbuild::core::KeyType::KeyType(&local_280,"value-R");
  pVVar3 = llbuild::core::BuildEngine::build((BuildEngine *)&db,&local_280);
  local_260 = intFromValue(pVVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_258,"valueA * 3","intFromValue(engine.build(\"value-R\"))",&local_25c
             ,&local_260);
  llbuild::core::KeyType::~KeyType(&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x213,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_a4 = 5;
  local_2a4 = 0xf;
  llbuild::core::KeyType::KeyType(&local_2c8,"value-R");
  pVVar3 = llbuild::core::BuildEngine::build((BuildEngine *)&db,&local_2c8);
  local_2a8 = intFromValue(pVVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a0,"valueA * 3","intFromValue(engine.build(\"value-R\"))",&local_2a4
             ,&local_2a8);
  llbuild::core::KeyType::~KeyType(&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&valueRResult,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x217,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&valueRResult,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&valueRResult);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  this_01 = (unordered_map<llbuild::core::KeyType,_llbuild::core::Result,_std::hash<llbuild::core::KeyType>,_std::equal_to<llbuild::core::KeyType>,_std::allocator<std::pair<const_llbuild::core::KeyType,_llbuild::core::Result>_>_>
             *)(error.field_2._8_8_ + 0x28);
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar_2.message_,"value-R");
  value = std::
          unordered_map<llbuild::core::KeyType,_llbuild::core::Result,_std::hash<llbuild::core::KeyType>,_std::equal_to<llbuild::core::KeyType>,_std::allocator<std::pair<const_llbuild::core::KeyType,_llbuild::core::Result>_>_>
          ::operator[](this_01,(key_type *)&gtest_ar_2.message_);
  llbuild::core::KeyType::~KeyType((KeyType *)&gtest_ar_2.message_);
  local_314 = local_a4 * 3;
  local_318 = intFromValue(&value->value);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_310,"valueA * 3","intFromValue(valueRResult.value)",&local_314,
             &local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x21b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_33c = 1;
  local_348 = llbuild::core::DependencyKeyIDs::size(&value->dependencies);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_338,"1U","valueRResult.dependencies.size()",&local_33c,&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,0x21c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  std::__cxx11::string::~string((string *)local_90);
  llbuild::core::BuildEngine::~BuildEngine((BuildEngine *)&db);
  SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  return;
}

Assistant:

TEST(BuildEngineTest, incrementalDependency) {
  // Check that the engine properly clears the individual result dependencies
  // when a rule is rerun.
  //
  // Dependencies:
  //   value-R: (value-A)
  //
  // FIXME: This test is rather cumbersome for all it is trying to check, maybe
  // we need a logging BuildDB implementation or something that would be easier
  // to test against (or just update the trace to track it).

  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);

  // Attach a custom database, used to get the results.
  class CustomDB : public BuildDB {
  public:
    llvm::StringMap<bool> keyTable;
    
    std::unordered_map<KeyType, Result> ruleResults;

    virtual void attachDelegate(BuildDBDelegate* delegate) override { ; }

    virtual uint64_t getCurrentEpoch(bool* success_out, std::string* error_out) override {
      return 0;
    }
    virtual bool setCurrentIteration(uint64_t value, std::string* error_out) override { return true; }
    virtual bool lookupRuleResult(KeyID keyID,
                                  const KeyType& key,
                                  Result* result_out,
                                  std::string* error_out) override {
      return false;
    }
    virtual bool setRuleResult(KeyID key,
                               const Rule& rule,
                               const Result& result,
                               std::string* error_out) override {
      ruleResults[rule.key] = result;
      return true;
    }
    virtual bool buildStarted(std::string* error_out) override { return true; }
    virtual void buildComplete() override {}
    virtual bool getKeys(std::vector<KeyType>& keys_out, std::string* error_out) override { return false; }
    virtual bool getKeysWithResult(std::vector<KeyType> &keys_out, std::vector<Result> &results_out, std::string* error_out) override { return false; };
  };
  CustomDB *db = new CustomDB();
  std::string error;
  engine.attachDB(std::unique_ptr<CustomDB>(db), &error);

  int valueA = 2;
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "value-A", {}, [&] (const std::vector<int>& inputs) {
          return valueA; },
      [&](const ValueType& value) {
        return valueA == intFromValue(value);
      })));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "value-R", {"value-A"},
                   [&] (const std::vector<int>& inputs) {
                     EXPECT_EQ(1U, inputs.size());
                     EXPECT_EQ(valueA, inputs[0]);
                     return inputs[0] * 3;
                   })));

  // Build the first result.
  EXPECT_EQ(valueA * 3, intFromValue(engine.build("value-R")));

  // Mark value-A as having changed, then rebuild.
  valueA = 5;
  EXPECT_EQ(valueA * 3, intFromValue(engine.build("value-R")));

  // Check the rule results.
  const Result& valueRResult = db->ruleResults["value-R"];
  EXPECT_EQ(valueA * 3, intFromValue(valueRResult.value));
  EXPECT_EQ(1U, valueRResult.dependencies.size());
}